

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

void __thiscall Assimp::D3DS::Node::~Node(Node *this)

{
  pointer ppNVar1;
  Node *this_00;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppNVar1 = (this->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mChildren).
                      super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <=
        (ulong)uVar2) break;
    this_00 = ppNVar1[uVar2];
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
    }
    operator_delete(this_00);
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
  ~_Vector_base(&(this->aCameraRollKeys).
                 super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
               );
  std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
            (&(this->aTargetPositionKeys).
              super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
  std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
            (&(this->aScalingKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
  std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
            (&(this->aPositionKeys).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
  std::_Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>::~_Vector_base
            (&(this->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>);
  std::__cxx11::string::~string((string *)&this->mDummyName);
  std::__cxx11::string::~string((string *)&this->mName);
  std::_Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::~_Vector_base
            (&(this->mChildren).
              super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>);
  return;
}

Assistant:

~Node()
    {
        for (unsigned int i = 0; i < mChildren.size();++i)
            delete mChildren[i];
    }